

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared.cpp
# Opt level: O2

bool closeEnough(string *reference,string *attempt,uint minLength)

{
  bool bVar1;
  bool bVar2;
  string local_40;
  
  bVar1 = compare(reference,attempt,false);
  bVar2 = true;
  if (!bVar1) {
    bVar2 = false;
    if (((ulong)minLength <= attempt->_M_string_length) &&
       (bVar2 = false, attempt->_M_string_length < reference->_M_string_length)) {
      std::__cxx11::string::substr((ulong)&local_40,(ulong)reference);
      bVar2 = compare(&local_40,attempt,false);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return bVar2;
}

Assistant:

bool closeEnough (
  const std::string& reference,
  const std::string& attempt,
  unsigned int minLength /* = 0 */)
{
  // An exact match is accepted first.
  if (compare (reference, attempt, false))
    return true;

  // A partial match will suffice.
  if (attempt.length () < reference.length () &&
      attempt.length () >= minLength)
    return compare (reference.substr (0, attempt.length ()), attempt, false);

  return false;
}